

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

Token * errorToken(Token *__return_storage_ptr__,char *message)

{
  size_t sVar1;
  
  __return_storage_ptr__->type = TOKEN_ERROR;
  __return_storage_ptr__->start = message;
  sVar1 = strlen(message);
  __return_storage_ptr__->length = (int)sVar1;
  __return_storage_ptr__->line = scanner.line;
  return __return_storage_ptr__;
}

Assistant:

static Token errorToken(const char *message) {
    Token token;
    token.type = TOKEN_ERROR;
    token.start = message;
    token.length = (int) strlen(message);
    token.line = scanner.line;

    return token;
}